

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_adj.hpp
# Opt level: O2

void __thiscall Omega_h::Adj::~Adj(Adj *this)

{
  Write<signed_char>::~Write(&(this->codes).write_);
  Graph::~Graph(&this->super_Graph);
  return;
}

Assistant:

OMEGA_H_INLINE Adj() {}